

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_digest.c
# Opt level: O1

void digest_cleanup_one(digestdata *d)

{
  if (d->nonce != (char *)0x0) {
    (*Curl_cfree)(d->nonce);
    d->nonce = (char *)0x0;
  }
  if (d->cnonce != (char *)0x0) {
    (*Curl_cfree)(d->cnonce);
    d->cnonce = (char *)0x0;
  }
  if (d->realm != (char *)0x0) {
    (*Curl_cfree)(d->realm);
    d->realm = (char *)0x0;
  }
  if (d->opaque != (char *)0x0) {
    (*Curl_cfree)(d->opaque);
    d->opaque = (char *)0x0;
  }
  if (d->qop != (char *)0x0) {
    (*Curl_cfree)(d->qop);
    d->qop = (char *)0x0;
  }
  if (d->algorithm != (char *)0x0) {
    (*Curl_cfree)(d->algorithm);
    d->algorithm = (char *)0x0;
  }
  d->nc = 0;
  d->algo = 0;
  d->stale = false;
  return;
}

Assistant:

static void digest_cleanup_one(struct digestdata *d)
{
  Curl_safefree(d->nonce);
  Curl_safefree(d->cnonce);
  Curl_safefree(d->realm);
  Curl_safefree(d->opaque);
  Curl_safefree(d->qop);
  Curl_safefree(d->algorithm);

  d->nc = 0;
  d->algo = CURLDIGESTALGO_MD5; /* default algorithm */
  d->stale = FALSE; /* default means normal, not stale */
}